

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O1

void sendError(UA_SecureChannel *channel,UA_ByteString *msg,size_t offset,UA_DataType *responseType,
              UA_UInt32 requestId,UA_StatusCode error)

{
  ushort uVar1;
  long lVar2;
  UA_StatusCode UVar3;
  long *__s;
  long alStack_d0 [2];
  UA_RequestHeader requestHeader;
  undefined1 local_50 [8];
  timeval tv;
  size_t offset_local;
  
  alStack_d0[0] = 0x12be3b;
  tv.tv_usec = offset;
  UVar3 = UA_decodeBinary(msg,(size_t *)&tv.tv_usec,alStack_d0 + 1,UA_TYPES + 0x1d);
  if (UVar3 == 0) {
    uVar1 = responseType->memSize;
    lVar2 = -(ulong)(uVar1 + 0xf & 0xfffffff0);
    __s = (long *)((long)alStack_d0 + lVar2 + 8U);
    *(undefined8 *)((long)alStack_d0 + lVar2) = 0x12be66;
    memset(__s,0,(ulong)uVar1);
    *(undefined4 *)((long)&requestHeader + lVar2) = (undefined4)requestHeader.timestamp;
    *(undefined8 *)((long)alStack_d0 + lVar2) = 0x12be87;
    gettimeofday((timeval *)local_50,(__timezone_ptr_t)0x0);
    *__s = (long)local_50 * 10000000 + tv.tv_sec * 10 + 0x19db1ded53e8000;
    *(UA_StatusCode *)((long)&requestHeader + lVar2 + 4) = error;
    *(undefined8 *)((long)alStack_d0 + lVar2) = 0x12bec4;
    UA_SecureChannel_sendBinaryMessage(channel,requestId,__s,responseType);
    *(undefined8 *)((long)alStack_d0 + lVar2) = 0x12bed3;
    deleteMembers_noInit(alStack_d0 + 1,UA_TYPES + 0x1d);
    requestHeader.additionalHeader.content._16_8_ = 0;
    requestHeader.additionalHeader.content.encoded.body.length = 0;
    requestHeader.additionalHeader.content.decoded.type = (UA_DataType *)0x0;
    requestHeader.additionalHeader.content.decoded.data = (void *)0x0;
    requestHeader.timeoutHint = 0;
    requestHeader._60_4_ = 0;
    requestHeader.additionalHeader.encoding = UA_EXTENSIONOBJECT_ENCODED_NOBODY;
    requestHeader.additionalHeader._4_4_ = 0;
    requestHeader.auditEntryId.length = 0;
    requestHeader.auditEntryId.data = (UA_Byte *)0x0;
    requestHeader.timestamp = 0;
    requestHeader.requestHandle = 0;
    requestHeader.returnDiagnostics = 0;
    requestHeader.authenticationToken.identifier.string.length = 0;
    requestHeader.authenticationToken.identifier.string.data = (UA_Byte *)0x0;
    alStack_d0[1] = 0;
    requestHeader.authenticationToken.namespaceIndex = 0;
    requestHeader.authenticationToken._2_2_ = 0;
    requestHeader.authenticationToken.identifierType = UA_NODEIDTYPE_NUMERIC;
    *(undefined8 *)((long)alStack_d0 + lVar2) = 0x12bf07;
    deleteMembers_noInit(__s,UA_TYPES + 0x47);
    *(undefined8 *)((long)alStack_d0 + lVar2) = 0x12bf16;
    memset(__s,0,0x88);
  }
  return;
}

Assistant:

static void
sendError(UA_SecureChannel *channel, const UA_ByteString *msg,
          size_t offset, const UA_DataType *responseType,
          UA_UInt32 requestId, UA_StatusCode error) {
    UA_RequestHeader requestHeader;
    UA_StatusCode retval = UA_RequestHeader_decodeBinary(msg, &offset, &requestHeader);
    if(retval != UA_STATUSCODE_GOOD)
        return;
    void *response = UA_alloca(responseType->memSize);
    UA_init(response, responseType);
    UA_ResponseHeader *responseHeader = (UA_ResponseHeader*)response;
    responseHeader->requestHandle = requestHeader.requestHandle;
    responseHeader->timestamp = UA_DateTime_now();
    responseHeader->serviceResult = error;
    UA_SecureChannel_sendBinaryMessage(channel, requestId, response, responseType);
    UA_RequestHeader_deleteMembers(&requestHeader);
    UA_ResponseHeader_deleteMembers(responseHeader);
}